

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>
           *this,Boxed_Value *param)

{
  Type_Conversions *this_00;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Boxed_Value BVar2;
  array<chaiscript::Boxed_Value,_1UL> params;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  undefined1 local_f8 [16];
  undefined1 local_e8 [32];
  pthread_rwlock_t local_c8;
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  _Stack_90;
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  _Stack_60;
  undefined8 uStack_30;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_28;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_f8._0_8_ = *in_RDX;
  local_f8._8_8_ = in_RDX[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count + 1;
    }
  }
  this_00 = (Type_Conversions *)
            param[1].m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (Type_Conversions *)0x0) {
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_90._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._48_8_ = 0;
    _Stack_90._M_impl._0_8_ = 0;
    local_c8._32_8_ = 0;
    local_c8.__data.__pad2 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8.__align = 0;
    local_c8._8_8_ = (Conversion_Saves *)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &_Stack_60._M_impl.super__Rb_tree_header._M_header;
    _Stack_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_60._M_impl._0_8_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    uStack_30 = 0;
    _Stack_90._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_90._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e8._8_8_ = Type_Conversions::conversion_saves((Type_Conversions *)&local_c8.__data);
    local_e8._24_8_ = local_e8;
    local_e8._0_8_ = &local_c8;
    local_e8._16_8_ = local_f8;
    Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::call
              ((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                *)this,(Function_Params *)param,(Type_Conversions_State *)(local_e8 + 0x10));
    chaiscript::detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::
    ~Thread_Storage(&local_20);
    chaiscript::detail::threading::
    Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
    ::~Thread_Storage(&local_28);
    Catch::clara::std::
    _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
    ::~_Rb_tree(&_Stack_60);
    Catch::clara::std::
    _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
    ::~_Rb_tree(&_Stack_90);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_c8._8_8_ = Type_Conversions::conversion_saves(this_00);
    local_e8._8_8_ = local_e8;
    local_e8._0_8_ = (pthread_rwlock_t *)local_f8;
    local_c8.__align = (long)this_00;
    BVar2 = Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>::
            call((Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
                  *)this,(Function_Params *)param,(Type_Conversions_State *)local_e8);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }